

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::BeginRead3dmBigChunk(ON_BinaryArchive *this,uint *typecode,ON__INT64 *value)

{
  uint uVar1;
  ulong uVar2;
  ulong bytes_forward;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ON__UINT64 bytes_backward;
  ON__UINT32 t;
  ON__INT64 v;
  ON__UINT64 sizeof_file;
  ON__UINT32 local_44;
  ulong local_40;
  ON__UINT64 local_38;
  
  bVar3 = ReadMode(this);
  if (!bVar3) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1893,"","ReadMode() = false.");
    if (typecode != (uint *)0x0) {
      *typecode = 0;
    }
    if (value != (ON__INT64 *)0x0) {
      *value = 0;
    }
    return false;
  }
  local_44 = 0;
  local_40 = 0;
  this->m_bDoChunkCRC = false;
  uVar1 = this->m_error_message_mask;
  this->m_error_message_mask = uVar1 | 1;
  bVar3 = ReadChunkTypecode(this,&local_44);
  this->m_error_message_mask = uVar1;
  if (!bVar3) goto LAB_003c3274;
  if (local_44 == 0x7fff) {
    local_38 = 0;
    bVar3 = ReadChunkValue(this,0x7fff,(ON__INT64 *)&local_40);
    bytes_forward = local_40;
    if (((long)local_40 < 0 || !bVar3) || (local_40 < (ulong)(0x31 < this->m_3dm_version) * 4 + 4))
    {
      bVar3 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x18d5,"","ON_BinaryArchive::BeginRead3dmChunk() - file is damaged.");
      local_44 = 0;
      goto LAB_003c3276;
    }
    uVar2 = this->m_current_positionX;
    bVar3 = ReadEOFSizeOfFile(this,&local_38);
    bytes_backward = this->m_current_positionX - uVar2;
    if ((this->m_current_positionX < uVar2 || bytes_backward == 0) || uVar2 == 0) {
      if (bVar3) goto LAB_003c32a5;
    }
    else {
      bVar4 = SeekBackward(this,bytes_backward);
      if (bVar3 && bVar4) {
LAB_003c32a5:
        bVar3 = SeekForward(this,bytes_forward);
        if (bVar3) {
          if (this->m_3dm_version < 2) {
            iVar5 = (*this->_vptr_ON_BinaryArchive[5])(this);
            if ((char)iVar5 == '\0') {
              local_44 = 0x7ffe;
            }
          }
          else if (this->m_current_positionX != local_38) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x18ca,"",
                       "ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
          }
          bVar3 = SeekBackward(this,bytes_forward);
          goto LAB_003c3226;
        }
        goto LAB_003c322a;
      }
    }
  }
  else {
    bVar3 = ReadChunkValue(this,local_44,(ON__INT64 *)&local_40);
LAB_003c3226:
    if (bVar3 != false) {
LAB_003c322a:
      PushBigChunk(this,local_44,local_40);
      bVar3 = true;
      goto LAB_003c3276;
    }
  }
LAB_003c3274:
  bVar3 = false;
LAB_003c3276:
  if (typecode != (uint *)0x0) {
    *typecode = local_44;
  }
  if (value != (ON__INT64 *)0x0) {
    *value = local_40;
  }
  return bVar3;
}

Assistant:

bool ON_BinaryArchive::BeginRead3dmBigChunk( unsigned int* typecode, ON__INT64* value )
{
  if (false == ReadMode())
  {
    ON_ERROR("ReadMode() = false.");
    if (typecode)
      *typecode = 0;
    if (value)
      *value = 0;
    return false;
  }

  ON__UINT32 t = 0;
  ON__INT64 v = 0;
  m_bDoChunkCRC = false; // no CRC on chunk headers because length is written twice
  const unsigned int saved_error_message_mask = m_error_message_mask;
  m_error_message_mask |= 0x0001; // disable ReadByte() error message at EOF
  bool rc = ReadChunkTypecode( &t );
  m_error_message_mask = saved_error_message_mask;
  if (rc) 
  {
    if ( t == TCODE_ENDOFFILE ) 
    {
      // Either this chunk is a bona fide end of file mark, or it's "goo" 
      // that Rhino 1.0 or the pre-February 2000 Rhino 1.1 saved and wrote.
      ON__UINT64 sizeof_file = 0;
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc && v >= 0 && ((ON__UINT64)v) >= SizeofChunkLength() ) 
      {
        ON__UINT64 EOF_chunk_length = (ON__UINT64)v;
        ON__UINT64 pos0 = CurrentPosition();
        rc = ReadEOFSizeOfFile( &sizeof_file );
        ON__UINT64 pos1 = CurrentPosition();
        if ( pos0 > 0 && pos1 > pos0 )
        {
          if ( !SeekBackward(pos1-pos0) )
            rc = false;
        }
        if ( rc ) 
        {
          if ( SeekForward( EOF_chunk_length ) )
          {
            ON__UINT64 pos2 = CurrentPosition(); 
            if ( m_3dm_version <= 1 )
            {
              if ( !AtEnd() ) 
              {
                // Rhino v1 reads chunks with unknown typecodes as a block of "goo"
                // and then saves them back into file.  When this happens to an
                // eof marker, we get TCODE_ENDOFFILE chunks in the middle of a file.
                // This can only happen in m_3dm_version = 1 files.
                t = TCODE_ENDOFFILE_GOO;
              }
            }
            else
            {
              // check that current position matches saved file size
              if ( pos2 != sizeof_file ) {
                ON_ERROR("ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
              }
            }
            rc = SeekBackward( EOF_chunk_length );
          }
        }
        if ( rc )
          rc = PushBigChunk( t, v );
      }
      else 
      {
        ON_ERROR( "ON_BinaryArchive::BeginRead3dmChunk() - file is damaged." );
        rc = false;
        t = 0; // ?? file is trashed ??
      }
    }
    else 
    {
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc )
        rc = PushBigChunk( t, v );
    }
  }
  if ( typecode )
    *typecode = t;
  if ( value )
    *value = v;
  return rc;
}